

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

Oop __thiscall
Lodtalk::ASTInterpreter::visitMessageSendNode(ASTInterpreter *this,MessageSendNode *node)

{
  InterpreterProxy *pIVar1;
  bool bVar2;
  Node *pNVar3;
  vector<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_> *this_00
  ;
  size_type sVar4;
  const_reference ppMVar5;
  vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *this_01;
  reference ppNVar6;
  Oop OVar7;
  MessageSendNode *local_98;
  Node **arg;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *__range2;
  vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *arguments;
  value_type message;
  int i;
  vector<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_> *chained
  ;
  MessageSendNode *node_local;
  ASTInterpreter *this_local;
  
  pNVar3 = AST::MessageSendNode::getReceiver(node);
  (*pNVar3->_vptr_Node[2])(pNVar3,this);
  this_00 = AST::MessageSendNode::getChainedMessages(node);
  for (message._4_4_ = -1;
      sVar4 = std::
              vector<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_>
              ::size(this_00), message._4_4_ < (int)sVar4; message._4_4_ = message._4_4_ + 1) {
    local_98 = node;
    if (-1 < message._4_4_) {
      ppMVar5 = std::
                vector<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_>
                ::operator[](this_00,(long)message._4_4_);
      local_98 = *ppMVar5;
    }
    if (message._4_4_ != -1) {
      (*this->interpreter->_vptr_InterpreterProxy[6])();
    }
    sVar4 = std::
            vector<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_>
            ::size(this_00);
    if (message._4_4_ + 1 != (int)sVar4) {
      (*this->interpreter->_vptr_InterpreterProxy[8])();
    }
    this_01 = AST::MessageSendNode::getArguments(local_98);
    __end2 = std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::begin
                       (this_01);
    arg = (Node **)std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::end
                             (this_01);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<Lodtalk::AST::Node_*const_*,_std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>_>
                                       *)&arg), bVar2) {
      ppNVar6 = __gnu_cxx::
                __normal_iterator<Lodtalk::AST::Node_*const_*,_std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>_>
                ::operator*(&__end2);
      (*(*ppNVar6)->_vptr_Node[2])(*ppNVar6,this);
      __gnu_cxx::
      __normal_iterator<Lodtalk::AST::Node_*const_*,_std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>_>
      ::operator++(&__end2);
    }
    pIVar1 = this->interpreter;
    OVar7 = AST::MessageSendNode::getSelectorOop(local_98);
    sVar4 = std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::size(this_01);
    (*pIVar1->_vptr_InterpreterProxy[0x23])(pIVar1,OVar7.field_0,sVar4 & 0xffffffff);
  }
  Oop::Oop((Oop *)&this_local);
  return (Oop)(anon_union_8_4_0eb573b0_for_Oop_0)this_local;
}

Assistant:

Oop ASTInterpreter::visitMessageSendNode(MessageSendNode *node)
{
	// Evaluate the receiver.
	node->getReceiver()->acceptVisitor(this);
	auto &chained = node->getChainedMessages();

	// Send each message in the chain
	for(int i = -1; i < (int)chained.size(); ++i)
	{
		auto message = i < 0 ? node : chained[i];
        // Duplicate the receiver for the next chains
        if(i != -1)
            interpreter->popOop();
        if(i + 1 != (int)chained.size())
            interpreter->duplicateStackTop();

		// Evaluate the arguments.
		auto &arguments = message->getArguments();
		for(auto &arg : arguments)
            arg->acceptVisitor(this);

        interpreter->sendMessageWithSelector(message->getSelectorOop(), (int)arguments.size());
	}

	return Oop();
}